

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_replaceFirst_with
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  long lVar2;
  bool bVar3;
  undefined8 *puVar4;
  long lVar5;
  string *type;
  long lVar6;
  undefined1 local_60 [16];
  shared_ptr<Instance> instance;
  shared_ptr<Instance> temporary;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  value = &this->_element_type;
  get_shared_instance((string *)&instance,value);
  type = (string *)&temporary;
  get_shared_instance(type,value);
  lVar5 = -1;
  lVar2 = -0x10;
  do {
    lVar6 = lVar2;
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = lVar5 + 1;
    if ((int)((ulong)((long)(this->_value).
                            super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4) <=
        lVar5) goto LAB_00156f55;
    bVar3 = InstanceIsEqualToComparator::operator()
                      ((InstanceIsEqualToComparator *)type,
                       (shared_ptr<Instance> *)
                       ((long)&psVar1[1].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + lVar6),&instance);
    lVar2 = lVar6 + 0x10;
  } while (!bVar3);
  get_shared_instance((string *)local_60,value);
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->_value).
                     super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar6),
             (__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
LAB_00156f55:
  std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&temporary.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string VectorInstance::op_replaceFirst_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[1]);
    for (int i = 0; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance)) {
            _value[i] = get_shared_instance(_element_type, arguments[1]);
            break;
        }
    return "null";
}